

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11TextureCalc.h
# Opt level: O0

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmGen11TextureCalc::GmmTexGetMipWidth
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  byte bVar1;
  ulong local_38;
  GmmGen11TextureCalc *local_30;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen11TextureCalc *this_local;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local = (GmmGen11TextureCalc *)0x0;
  }
  else {
    bVar1 = (byte)MipLevel;
    if (((ulong)(pTexInfo->Flags).Info >> 4 & 1) == 0) {
      if (pTexInfo->BaseWidth >> (bVar1 & 0x3f) == 0) {
        local_30 = (GmmGen11TextureCalc *)0x1;
      }
      else {
        local_30 = (GmmGen11TextureCalc *)(pTexInfo->BaseWidth >> (bVar1 & 0x3f));
      }
      this_local = local_30;
    }
    else if (pTexInfo->BaseWidth == 1) {
      this_local = (GmmGen11TextureCalc *)pTexInfo->BaseWidth;
    }
    else {
      if (pTexInfo->BaseWidth - 1 >> (bVar1 & 0x3f) == 0) {
        local_38 = 1;
      }
      else {
        local_38 = pTexInfo->BaseWidth - 1 >> (bVar1 & 0x3f);
      }
      this_local = (GmmGen11TextureCalc *)(local_38 + 1);
    }
  }
  return (GMM_GFX_SIZE_T)this_local;
}

Assistant:

virtual GMM_GFX_SIZE_T  GmmTexGetMipWidth(GMM_TEXTURE_INFO *pTexInfo, uint32_t MipLevel)
            {
                __GMM_ASSERTPTR(pTexInfo, 0);

                if (!pTexInfo->Flags.Info.CornerTexelMode)
                {
                    return(GFX_MAX(1, pTexInfo->BaseWidth >> MipLevel));
                }
                else
                {
                    if (pTexInfo->BaseWidth == 1)
                    {
                        return pTexInfo->BaseWidth;
                    }
                    else
                    {
                        return(GFX_MAX(1, (pTexInfo->BaseWidth - 1) >> MipLevel) + 1);
                    }
                }
            }